

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
          (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> bits)

{
  short sVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this_00;
  
  this_00 = in_RDI;
  sVar1 = ::SafeInt::operator_cast_to_short
                    ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)in_RDI)
  ;
  if (sVar1 < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x178b,
                  "SafeInt<T, E> &SafeInt<long long>::operator<<=(SafeInt<U, E>) [T = long long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = short]"
                 );
  }
  sVar1 = ::SafeInt::operator_cast_to_short
                    ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this_00
                    );
  if (sVar1 < 0x40) {
    sVar1 = ::SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       this_00);
    in_RDI->m_int = in_RDI->m_int << ((byte)sVar1 & 0x3f);
    return in_RDI;
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x178c,
                "SafeInt<T, E> &SafeInt<long long>::operator<<=(SafeInt<U, E>) [T = long long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = short]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator <<=( SafeInt< U, E > bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int <<= (U)bits;
        return *this;
    }